

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RequestMessage.cpp
# Opt level: O1

string * __thiscall
RequestMessage::getRequestHeadersValue
          (string *__return_storage_ptr__,RequestMessage *this,string *KEY)

{
  iterator iVar1;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->requsetHeaders)._M_t,KEY);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->requsetHeaders)._M_t._M_impl.super__Rb_tree_header
     ) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(iVar1._M_node + 2),
               (long)&(iVar1._M_node[2]._M_parent)->_M_color + *(long *)(iVar1._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

string RequestMessage::getRequestHeadersValue(const string& KEY)
{
    auto values=this->requsetHeaders.find(KEY);
    if(values!=this->requsetHeaders.end())//存在首部
    {
        return (*values).second;
    }
    else{//不存在首部
        return "";
    }
}